

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Reverb::render(V2Reverb *this,StereoSample *dest,int nsamples)

{
  V2Instance *pVVar1;
  float fVar2;
  float fVar3;
  float v;
  float local_68;
  float dz;
  float dv_1;
  int j_1;
  float lp;
  float nv;
  float dv;
  int j;
  float cur;
  int ch;
  float in;
  int i;
  float *inbuf;
  int nsamples_local;
  StereoSample *dest_local;
  V2Reverb *this_local;
  
  pVVar1 = this->inst;
  for (ch = 0; ch < nsamples; ch = ch + 1) {
    fVar2 = pVVar1->aux1buf[ch] * this->gainin + 3.8146973e-06;
    for (j = 0; j < 2; j = j + 1) {
      dv = 0.0;
      for (nv = 0.0; (int)nv < 4; nv = (float)((int)nv + 1)) {
        local_68 = this->gainc[(int)nv];
        fVar3 = V2Delay::fetch((V2Delay *)(this->gaina + (long)j * 0x10 + (long)(int)nv * 4 + 6));
        local_68 = local_68 * fVar3;
        if (((uint)nv & 1) == 0) {
          local_68 = local_68 + fVar2;
        }
        else {
          local_68 = local_68 - fVar2;
        }
        fVar3 = this->damp * (local_68 - this->combl[j][(int)nv]) + this->combl[j][(int)nv];
        V2Delay::feed((V2Delay *)(this->gaina + (long)j * 0x10 + (long)(int)nv * 4 + 6),fVar3);
        dv = fVar3 + dv;
      }
      for (dz = 0.0; (int)dz < 2; dz = (float)((int)dz + 1)) {
        fVar3 = V2Delay::fetch((V2Delay *)(this->combl + (long)j * 2 + (long)(int)dz + 2));
        v = this->gaina[(int)dz] * fVar3 + dv;
        V2Delay::feed((V2Delay *)(this->combl + (long)j * 2 + (long)(int)dz + 2),v);
        dv = -this->gaina[(int)dz] * v + fVar3;
      }
      this->hpf[j] = this->lowcut * (dv - this->hpf[j]) + this->hpf[j];
      dest->ch[(long)ch * 2 + (long)j] = (dv - this->hpf[j]) + dest->ch[(long)ch * 2 + (long)j];
    }
  }
  return;
}

Assistant:

void render(StereoSample *dest, int nsamples)
    {
        const float *inbuf = inst->aux1buf;

        COVER("RVB render");

        for (int i=0; i < nsamples; i++)
        {
            float in = inbuf[i] * gainin + fcdcoffset;

            for (int ch=0; ch < 2; ch++)
            {
                // parallel comb filters
                float cur = 0.0f;
                for (int j=0; j < 4; j++)
                {
                    float dv = gainc[j] * combd[ch][j].fetch();
                    float nv = (j & 1) ? (dv - in) : (dv + in); // alternate phase on combs
                    float lp = combl[ch][j] + damp * (nv - combl[ch][j]);
                    combd[ch][j].feed(lp);
                    cur += lp;
                }

                // serial allpass filters
                for (int j=0; j < 2; j++)
                {
                    float dv = alld[ch][j].fetch();
                    float dz = cur + gaina[j] * dv;
                    alld[ch][j].feed(dz);
                    cur = dv - gaina[j] * dz;
                }

                // low cut and output
                hpf[ch] += lowcut * (cur - hpf[ch]);
                dest[i].ch[ch] += cur - hpf[ch];
            }
        }
    }